

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_recorder.h
# Opt level: O2

HashtablezInfo * __thiscall
absl::lts_20240722::profiling_internal::
SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo>::
Register<long_const&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_short&>
          (SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo> *this,long *args,
          unsigned_long *args_1,unsigned_long *args_2,unsigned_long *args_3,unsigned_short *args_4)

{
  atomic<unsigned_long> *paVar1;
  ulong uVar2;
  HashtablezInfo *this_00;
  MutexLock sample_lock;
  
  LOCK();
  paVar1 = &this->size_estimate_;
  uVar2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  if ((this->max_samples_).super___atomic_base<unsigned_long>._M_i < uVar2) {
    LOCK();
    (this->size_estimate_).super___atomic_base<unsigned_long>._M_i =
         (this->size_estimate_).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    LOCK();
    (this->dropped_samples_).super___atomic_base<unsigned_long>._M_i =
         (this->dropped_samples_).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    this_00 = (HashtablezInfo *)0x0;
  }
  else {
    this_00 = PopDead<long,unsigned_long,unsigned_long,unsigned_long,unsigned_short>
                        (this,*args,*args_1,*args_2,*args_3,*args_4);
    if (this_00 == (HashtablezInfo *)0x0) {
      this_00 = (HashtablezInfo *)operator_new(0x2a0);
      container_internal::HashtablezInfo::HashtablezInfo(this_00);
      sample_lock.mu_ = (Mutex *)this_00;
      absl::lts_20240722::Mutex::Lock();
      absl::lts_20240722::Mutex::ForgetDeadlockInfo();
      container_internal::HashtablezInfo::PrepareForSampling
                (this_00,*args,*args_1,*args_2,*args_3,*args_4);
      MutexLock::~MutexLock(&sample_lock);
      PushNew(this,this_00);
    }
  }
  return this_00;
}

Assistant:

T* SampleRecorder<T>::Register(Targs&&... args) {
  size_t size = size_estimate_.fetch_add(1, std::memory_order_relaxed);
  if (size > max_samples_.load(std::memory_order_relaxed)) {
    size_estimate_.fetch_sub(1, std::memory_order_relaxed);
    dropped_samples_.fetch_add(1, std::memory_order_relaxed);
    return nullptr;
  }

  T* sample = PopDead(args...);
  if (sample == nullptr) {
    // Resurrection failed.  Hire a new warlock.
    sample = new T();
    {
      absl::MutexLock sample_lock(&sample->init_mu);
      // If flag initialization happens to occur (perhaps in another thread)
      // while in this block, it will lock `graveyard_` which is usually always
      // locked before any sample. This will appear as a lock inversion.
      // However, this code is run exactly once per sample, and this sample
      // cannot be accessed until after it is returned from this method.  This
      // means that this lock state can never be recreated, so we can safely
      // inform the deadlock detector to ignore it.
      sample->init_mu.ForgetDeadlockInfo();
      sample->PrepareForSampling(std::forward<Targs>(args)...);
    }
    PushNew(sample);
  }

  return sample;
}